

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_lexical_analysis.cpp
# Opt level: O1

compile_errcode __thiscall
LexicalAnalysis::ParseDigit(LexicalAnalysis *this,Symbol *symbol,bool negative)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  compile_errcode cVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  bVar1 = true;
  uVar9 = 0xffffffff;
  bVar6 = false;
  lVar10 = 0;
  do {
    lVar5 = lVar10;
    lVar8 = (long)this->ch;
    bVar7 = bVar6;
    if (lVar8 == 0x30) {
      bVar7 = true;
    }
    if (bVar1) {
      bVar1 = false;
      bVar6 = bVar7;
    }
    lVar10 = lVar5 * 10 + -0x30 + lVar8;
    iVar3 = fgetc((FILE *)this->fp_in);
    cVar2 = (char)iVar3;
    this->ch = cVar2;
    this->m_character_number = this->m_character_number + 1;
    uVar9 = uVar9 + 1;
  } while ((byte)(cVar2 - 0x30U) < 10);
  ungetc((int)cVar2,(FILE *)this->fp_in);
  iVar3 = this->m_character_number + -1;
  this->m_character_number = iVar3;
  cVar4 = -0x7d2;
  if (uVar9 < 9) {
    if (negative) {
      lVar10 = 0x30 - (lVar5 * 10 + lVar8);
    }
    if (((int)lVar10 == lVar10) && ((lVar10 == 0 || (!bVar6)))) {
      symbol->m_line_number = this->m_line_number;
      symbol->m_character_number = iVar3;
      symbol->m_name = INTERGER_SYM;
      Symbol::SetValue<int>(symbol,(int)lVar10);
      cVar4 = 0;
    }
  }
  return cVar4;
}

Assistant:

compile_errcode LexicalAnalysis::ParseDigit(Symbol& symbol, bool negative) {
    long sum = 0;
    int number_count = 0;
    bool first_flag = true;
    bool zero_flag = false;
    do {
        if (first_flag) {
            first_flag = false;
            if (ch == '0')
                zero_flag = true;
        }
        sum = sum * 10 + ch - '0';
        number_count++;
        GetChar();
    } while (c0_compile::isdigit(ch));
    UnGetChar();
    if (number_count < 10) {
        sum = negative ? (-1*sum) : sum;
        if (sum >= INT_MIN && sum <= INT_MAX) {
            if (sum != 0 && zero_flag) {
                return INVALID_DIGIT_ERROR;  // with front zero
            }
            symbol.SetLocate(m_line_number, m_character_number);
            symbol.SetName(INTERGER_SYM);
            symbol.SetValue<int>(sum);
            return COMPILE_OK;
        }
    }
    return INVALID_DIGIT_ERROR;
}